

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O3

void __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::
async_connect<std::function<void(std::error_code_const&)>,asio::any_io_executor>
          (reactive_socket_service<asio::ip::tcp> *this,implementation_type *impl,
          endpoint_type *peer_endpoint,function<void_(const_std::error_code_&)> *handler,
          any_io_executor *io_ex)

{
  reactive_socket_connect_op<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
  *this_00;
  undefined8 uVar1;
  size_t addrlen;
  long *in_FS_OFFSET;
  ptr local_48;
  
  if (*(long *)(*in_FS_OFFSET + -0x1420) == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(undefined8 *)(*(long *)(*in_FS_OFFSET + -0x1420) + 8);
  }
  local_48.h = handler;
  this_00 = (reactive_socket_connect_op<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
             *)thread_info_base::allocate<asio::detail::thread_info_base::default_tag>(uVar1,0xa0,8)
  ;
  local_48.p = (reactive_socket_connect_op<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
                *)0x0;
  local_48.v = this_00;
  reactive_socket_connect_op<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>::
  reactive_socket_connect_op
            (this_00,&(this->super_reactive_socket_service_base).success_ec_,
             (impl->super_base_implementation_type).socket_,handler,io_ex);
  addrlen = 0x1c;
  if ((peer_endpoint->impl_).data_.base.sa_family == 2) {
    addrlen = 0x10;
  }
  local_48.p = this_00;
  reactive_socket_service_base::
  start_connect_op<asio::detail::reactive_socket_connect_op<std::function<void(std::error_code_const&)>,asio::any_io_executor>>
            (&this->super_reactive_socket_service_base,&impl->super_base_implementation_type,this_00
             ,false,peer_endpoint,addrlen,io_ex,
             (enable_if_t<is_same<typename_associated_immediate_executor<typename_reactive_socket_connect_op<function<void_(const_error_code_&)>,_any_io_executor>::handler_type,_typename_reactive_socket_connect_op<function<void_(const_error_code_&)>,_any_io_executor>::io_executor_type>::asio_associated_immediate_executor_is_unspecialised,_void>::value>
              *)0x0);
  local_48.v = (reactive_socket_connect_op<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
                *)0x0;
  local_48.p = (reactive_socket_connect_op<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
                *)0x0;
  reactive_socket_connect_op<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>::
  ptr::reset(&local_48);
  return;
}

Assistant:

void async_connect(implementation_type& impl,
      const endpoint_type& peer_endpoint,
      Handler& handler, const IoExecutor& io_ex)
  {
    bool is_continuation =
      asio_handler_cont_helpers::is_continuation(handler);

    associated_cancellation_slot_t<Handler> slot
      = asio::get_associated_cancellation_slot(handler);

    // Allocate and construct an operation to wrap the handler.
    typedef reactive_socket_connect_op<Handler, IoExecutor> op;
    typename op::ptr p = { asio::detail::addressof(handler),
      op::ptr::allocate(handler), 0 };
    p.p = new (p.v) op(success_ec_, impl.socket_, handler, io_ex);

    // Optionally register for per-operation cancellation.
    if (slot.is_connected())
    {
      p.p->cancellation_key_ =
        &slot.template emplace<reactor_op_cancellation>(
            &reactor_, &impl.reactor_data_, impl.socket_, reactor::connect_op);
    }

    ASIO_HANDLER_CREATION((reactor_.context(), *p.p, "socket",
          &impl, impl.socket_, "async_connect"));

    start_connect_op(impl, p.p, is_continuation,
        peer_endpoint.data(), peer_endpoint.size(), &io_ex, 0);
    p.v = p.p = 0;
  }